

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetHeaderAngledMaxLabelWidth(void)

{
  float fVar1;
  ImGuiTable *pIVar2;
  ImGuiTableColumn *pIVar3;
  char *unaff_retaddr;
  char *in_stack_00000008;
  int column_n;
  float width;
  ImGuiTable *table;
  ImGuiContext *g;
  float local_20;
  int i;
  float lhs;
  ImGuiContext *pIVar4;
  
  pIVar2 = GImGui->CurrentTable;
  lhs = 0.0;
  pIVar4 = GImGui;
  for (i = 0; i < pIVar2->ColumnsCount; i = i + 1) {
    if (((pIVar2->EnabledMaskByIndex[i >> 5] & 1 << ((byte)i & 0x1f)) != 0) &&
       (pIVar3 = ImSpan<ImGuiTableColumn>::operator[](&pIVar2->Columns,i),
       (pIVar3->Flags & 0x40000U) != 0)) {
      TableGetColumnName((ImGuiTable *)CONCAT44(lhs,i),(int)local_20._4_4_);
      _local_20 = CalcTextSize(in_stack_00000008,unaff_retaddr,SUB81((ulong)pIVar4 >> 0x38,0),
                               SUB84(pIVar4,0));
      lhs = ImMax<float>(lhs,local_20);
    }
  }
  fVar1 = (pIVar4->Style).CellPadding.y;
  return fVar1 + fVar1 + lhs;
}

Assistant:

float ImGui::TableGetHeaderAngledMaxLabelWidth()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    float width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (IM_BITARRAY_TESTBIT(table->EnabledMaskByIndex, column_n))
            if (table->Columns[column_n].Flags & ImGuiTableColumnFlags_AngledHeader)
                width = ImMax(width, CalcTextSize(TableGetColumnName(table, column_n), NULL, true).x);
    return width + g.Style.CellPadding.y * 2.0f; // Swap padding
}